

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printDualSolution<double>
               (SoPlexBase<double> *soplex,NameSet *colnames,NameSet *rownames,bool real,
               bool rational)

{
  int iVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  element_type *peVar5;
  SPxOut *pSVar6;
  SPxOut *o;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_19;
  Verbosity old_verbosity_18;
  Verbosity old_verbosity_17;
  int i_5;
  Verbosity old_verbosity_16;
  VectorRational redcost_1;
  Verbosity old_verbosity_15;
  Verbosity old_verbosity_14;
  int i_4;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  VectorRational dual_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int i_2;
  Verbosity old_verbosity_6;
  VectorBase<double> redcost;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<double> dual;
  int printwidth;
  int printprec;
  SoPlexBase<double> *in_stack_fffffffffffff858;
  SoPlexBase<double> *in_stack_fffffffffffff860;
  SoPlexBase<double> *in_stack_fffffffffffff868;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffff870;
  SPxOut *in_stack_fffffffffffff8a8;
  SPxOut *in_stack_fffffffffffff8b0;
  SPxOut *in_stack_fffffffffffff8b8;
  Verbosity local_478;
  Verbosity local_474 [3];
  undefined1 local_468 [68];
  Verbosity local_424;
  Verbosity local_420 [2];
  undefined1 local_418 [68];
  int local_3d4;
  Verbosity local_3d0;
  Verbosity local_3cc [7];
  Verbosity local_3b0;
  Verbosity local_3ac;
  undefined1 local_3a8 [68];
  Verbosity local_364;
  Verbosity local_360 [2];
  undefined1 local_358 [76];
  int local_30c;
  Verbosity local_308;
  Verbosity local_304 [3];
  undefined1 local_2f8 [76];
  int local_2ac;
  int local_2a8;
  Verbosity local_2a4;
  Verbosity local_2a0 [2];
  undefined1 local_298 [76];
  int local_24c;
  Verbosity local_248;
  Verbosity local_244 [8];
  Verbosity local_224;
  Verbosity local_220;
  int local_21c;
  int local_204;
  Verbosity local_200;
  Verbosity local_1fc;
  int local_1f8;
  int local_1f4;
  Verbosity local_1f0;
  Verbosity local_1ec [6];
  int local_1d4;
  Verbosity local_1d0;
  Verbosity local_1cc [8];
  int local_1ac;
  int local_194;
  Verbosity local_190;
  Verbosity local_18c;
  int local_188;
  int local_184;
  Verbosity local_180;
  Verbosity local_17c [5];
  int local_168;
  Verbosity local_164;
  Verbosity local_160;
  int local_15c;
  int local_144;
  Verbosity local_140;
  Verbosity local_13c;
  int local_138;
  int local_134;
  Verbosity local_130;
  Verbosity local_12c [6];
  int local_114;
  Verbosity local_110;
  Verbosity local_10c [16];
  int local_cc;
  int local_c8;
  byte local_c2;
  byte local_c1;
  long local_b0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  Verbosity *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  Verbosity *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  Verbosity *local_28;
  undefined1 *local_20;
  Verbosity *local_18;
  Verbosity *local_10;
  Verbosity *local_8;
  
  local_c1 = in_CL & 1;
  local_c2 = in_R8B & 1;
  local_b0 = in_RDI;
  ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1373df);
  __x = ::soplex::Tolerances::epsilon(peVar5);
  dVar7 = log10(__x);
  local_c8 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x13742f);
  local_cc = local_c8 + 10;
  if ((local_c1 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x13745b);
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)in_stack_fffffffffffff870,
               (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getDualFarkas
                      (in_stack_fffffffffffff868,(VectorBase<double> *)in_stack_fffffffffffff860);
    if (bVar2) {
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_10c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_110 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_110);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_10c);
      }
      for (local_114 = 0; iVar1 = local_114,
          iVar4 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x1375ae),
          iVar1 < iVar4; local_114 = local_114 + 1) {
        ::soplex::VectorBase<double>::operator[]
                  ((VectorBase<double> *)in_stack_fffffffffffff860,
                   (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x137618);
        ::soplex::Tolerances::epsilon(peVar5);
        bVar2 = ::soplex::isNotZero<double,double>
                          ((double)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x137658)
        ;
        if (((bVar2) && (local_b0 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_12c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_130 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_130);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_134 = (int)std::setw(local_cc);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_138 = (int)std::setprecision(local_c8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_12c);
        }
      }
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_13c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_140 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_140);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        local_144 = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff858,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x137958);
        ::soplex::Tolerances::epsilon(peVar5);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
        local_15c = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff858,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x137a19)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_13c);
      }
    }
    else {
      bVar2 = ::soplex::SoPlexBase<double>::isDualFeasible(in_stack_fffffffffffff860);
      if ((bVar2) &&
         (bVar2 = ::soplex::SoPlexBase<double>::getDual
                            (in_stack_fffffffffffff868,
                             (VectorBase<double> *)in_stack_fffffffffffff860), bVar2)) {
        if ((local_b0 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_160 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_164 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_164);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_160);
        }
        for (local_168 = 0; iVar1 = local_168,
            iVar4 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x137b7e),
            iVar1 < iVar4; local_168 = local_168 + 1) {
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137be8);
          ::soplex::Tolerances::epsilon(peVar5);
          bVar2 = ::soplex::isNotZero<double,double>
                            ((double)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x137c28);
          if (((bVar2) && (local_b0 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
            local_17c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
            local_180 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_180);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff860,
                       (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            local_184 = (int)std::setw(local_cc);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff858,
                       (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
            local_188 = (int)std::setprecision(local_c8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff858,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
            ::soplex::VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffff860,
                       (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_17c);
          }
        }
        if ((local_b0 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_18c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_190 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_190);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_194 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137f28);
          ::soplex::Tolerances::epsilon(peVar5);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
          local_1ac = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x137fe9);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_18c);
        }
        ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x138039);
        ::soplex::VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffff870,
                   (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
        bVar2 = ::soplex::SoPlexBase<double>::getRedCost
                          (in_stack_fffffffffffff868,(VectorBase<double> *)in_stack_fffffffffffff860
                          );
        if (bVar2) {
          if ((local_b0 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
            local_1cc[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
            local_1d0 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_1d0);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_1cc);
          }
          for (local_1d4 = 0; iVar1 = local_1d4,
              iVar4 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13816e),
              iVar1 < iVar4; local_1d4 = local_1d4 + 1) {
            ::soplex::VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffff860,
                       (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1381d8);
            ::soplex::Tolerances::epsilon(peVar5);
            bVar2 = ::soplex::isNotZero<double,double>
                              ((double)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x138218);
            if (((bVar2) && (local_b0 != -8)) &&
               (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
              local_1ec[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
              local_1f0 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_1f0);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff860,
                         (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
              local_1f4 = (int)std::setw(local_cc);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff858,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
              local_1f8 = (int)std::setprecision(local_c8);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff858,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
              ::soplex::VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffff860,
                         (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_1ec);
            }
          }
          if ((local_b0 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
            local_1fc = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
            local_200 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_200);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            local_204 = (int)std::setprecision(1);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff858,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
            ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff858);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x138518);
            ::soplex::Tolerances::epsilon(peVar5);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
            local_21c = (int)std::setprecision(8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff858,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x1385d9);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_1fc);
          }
        }
        ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x138628);
      }
      else if ((local_b0 != -8) &&
              (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_220 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_224 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_224);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_220);
      }
    }
    ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x1386f3);
  }
  if ((local_c2 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x138722);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getDualFarkasRational
                      (in_stack_fffffffffffff868,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff860);
    if (bVar2) {
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_244[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_248 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_248);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_244);
      }
      for (local_24c = 0; iVar1 = local_24c,
          iVar4 = ::soplex::SoPlexBase<double>::numRows((SoPlexBase<double> *)0x13884f),
          iVar1 < iVar4; local_24c = local_24c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff860,(int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_2a0[1] = 0;
        local_60 = local_298;
        local_68 = local_2a0 + 1;
        local_70 = 0;
        local_78 = 0;
        local_8 = local_68;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff8b8,(longlong *)in_stack_fffffffffffff8b0,
                   in_stack_fffffffffffff8a8);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff858,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x138916);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x13892c);
        if (((bVar2) && (local_b0 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_2a0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_2a4 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_2a4);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_2a8 = (int)std::setw(local_cc);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_2ac = (int)std::setprecision(local_c8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_a8 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff860,
                                  (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          local_a0 = local_2f8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff870,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff868);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x138b06);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_2a0);
        }
      }
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_304[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_304[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_304 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_304 + 2);
      }
    }
    bVar2 = ::soplex::SoPlexBase<double>::isDualFeasible(in_stack_fffffffffffff860);
    if ((bVar2) &&
       (bVar2 = ::soplex::SoPlexBase<double>::getDualRational
                          (in_stack_fffffffffffff868,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff860), bVar2)) {
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_304[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_308 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_308);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_304);
      }
      for (local_30c = 0; iVar1 = local_30c,
          iVar4 = ::soplex::SoPlexBase<double>::numRowsRational((SoPlexBase<double> *)0x138d6d),
          iVar1 < iVar4; local_30c = local_30c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff860,(int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_360[1] = 0;
        local_40 = local_358;
        local_48 = local_360 + 1;
        local_50 = 0;
        local_58 = 0;
        local_10 = local_48;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff8b8,(longlong *)in_stack_fffffffffffff8b0,
                   in_stack_fffffffffffff8a8);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff858,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x138e34);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x138e4a);
        if (((bVar2) && (local_b0 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_360[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_364 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_364);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          in_stack_fffffffffffff8b8 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_98 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff860,
                                  (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          local_90 = local_3a8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff870,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff868);
          in_stack_fffffffffffff8b0 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff860,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x138fa4);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_360);
        }
      }
      if ((local_b0 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
        local_3ac = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
        local_3b0 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_3b0);
        in_stack_fffffffffffff8a8 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_3ac);
      }
      ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x1390f3);
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
      bVar2 = ::soplex::SoPlexBase<double>::getRedCostRational
                        (in_stack_fffffffffffff868,(VectorRational *)in_stack_fffffffffffff860);
      if (bVar2) {
        if ((local_b0 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_3cc[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_3d0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_3d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_3cc);
        }
        for (local_3d4 = 0; iVar1 = local_3d4,
            iVar4 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x139219),
            iVar1 < iVar4; local_3d4 = local_3d4 + 1) {
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff860,(int)((ulong)in_stack_fffffffffffff858 >> 0x20))
          ;
          local_420[1] = 0;
          local_20 = local_418;
          local_28 = local_420 + 1;
          local_30 = 0;
          local_38 = 0;
          local_18 = local_28;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)in_stack_fffffffffffff8b8,(longlong *)in_stack_fffffffffffff8b0,
                     in_stack_fffffffffffff8a8);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff858,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x1392d1);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1392e4);
          if (((bVar2) && (local_b0 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
            local_420[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
            local_424 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_424);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff860,
                       (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            pSVar6 = ::soplex::operator<<
                               ((SPxOut *)in_stack_fffffffffffff860,
                                (char *)in_stack_fffffffffffff858);
            o = ::soplex::operator<<
                          ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            local_88 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff860,
                                    (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            local_80 = local_468;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)pSVar6,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)o);
            in_stack_fffffffffffff860 =
                 (SoPlexBase<double> *)
                 ::soplex::operator<<
                           ((SPxOut *)in_stack_fffffffffffff860,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x13943b);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_420);
          }
        }
        if ((local_b0 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
          local_474[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
          local_474[1] = 3;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_474 + 1);
          pSVar6 = ::soplex::operator<<
                             ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858)
          ;
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(_func_ostream_ptr_ostream_ptr *)pSVar6);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_474 + 2);
        }
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x13958a);
    }
    else if ((local_b0 != -8) &&
            (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8)), 2 < (int)VVar3)) {
      local_474[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b0 + 8));
      local_478 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),&local_478);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b0 + 8),local_474);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x139653);
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}